

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::SkipUntilNewline(AsciiParser *this)

{
  uint8_t uVar1;
  StreamReader *pSVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint64_t uVar8;
  
  pSVar2 = this->_sr;
  uVar3 = pSVar2->length_;
  uVar8 = pSVar2->idx_;
  do {
    if ((uVar3 <= uVar8) || (pSVar2->binary_[uVar8] == '\0')) goto LAB_0033a8d9;
    uVar5 = uVar8;
    if (uVar3 <= uVar8) goto LAB_0033a89b;
    uVar5 = uVar8 + 1;
    uVar1 = pSVar2->binary_[uVar8];
    pSVar2->idx_ = uVar5;
    iVar7 = 3;
    uVar6 = uVar5;
    if (uVar1 != '\n') {
      if ((uVar1 == '\r') && (uVar5 < uVar3 - 1)) {
        uVar6 = uVar8 + 2;
        if (uVar3 < uVar6) {
LAB_0033a89b:
          iVar7 = 1;
          uVar6 = uVar5;
        }
        else {
          uVar1 = pSVar2->binary_[uVar5];
          pSVar2->idx_ = uVar6;
          if (uVar1 != '\n') {
            uVar5 = uVar6;
            if (((long)uVar6 < 1) || (uVar6 = uVar8 + 1, pSVar2->length_ < uVar6))
            goto LAB_0033a89b;
            pSVar2->idx_ = uVar6;
          }
        }
      }
      else {
        iVar7 = 0;
      }
    }
    uVar8 = uVar6;
  } while (iVar7 == 0);
  if (iVar7 == 1) {
    bVar4 = false;
  }
  else {
LAB_0033a8d9:
    (this->_curr_cursor).row = (this->_curr_cursor).row + 1;
    (this->_curr_cursor).col = 0;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool AsciiParser::SkipUntilNewline() {
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '\n') {
      break;
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          return false;
        }

        if (d == '\n') {
          break;
        }

        // unwind 1 char
        if (!_sr->seek_from_current(-1)) {
          // this should not happen.
          return false;
        }

        break;
      }

    } else {
      // continue
    }
  }

  _curr_cursor.row++;
  _curr_cursor.col = 0;
  return true;
}